

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_bitstream.c
# Opt level: O1

void ihevcd_bits_init(bitstrm_t *ps_bitstrm,UWORD8 *pu1_buf,UWORD32 u4_numbytes)

{
  undefined1 auVar1 [16];
  
  ps_bitstrm->pu1_buf_base = pu1_buf;
  ps_bitstrm->pu4_buf = (UWORD32 *)(pu1_buf + 8);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)pu1_buf;
  auVar1 = pshufb(auVar1,_DAT_00170570);
  ps_bitstrm->u4_bit_ofst = 0;
  ps_bitstrm->u4_cur_word = (int)auVar1._0_8_;
  ps_bitstrm->u4_nxt_word = (int)((ulong)auVar1._0_8_ >> 0x20);
  ps_bitstrm->pu1_buf_max = pu1_buf + (ulong)u4_numbytes + 8;
  return;
}

Assistant:

void ihevcd_bits_init(bitstrm_t *ps_bitstrm,
                      UWORD8 *pu1_buf,
                      UWORD32 u4_numbytes)
{
    UWORD32 u4_cur_word;
    UWORD32 u4_nxt_word;
    UWORD32 u4_temp;
    UWORD32 *pu4_buf;

    pu4_buf     = (UWORD32 *)pu1_buf;
    u4_temp = *pu4_buf++;
    u4_cur_word = ITT_BIG_ENDIAN(u4_temp);
    u4_temp = *pu4_buf++;
    u4_nxt_word = ITT_BIG_ENDIAN(u4_temp);

    ps_bitstrm->u4_bit_ofst     = 0;
    ps_bitstrm->pu1_buf_base    = pu1_buf;
    ps_bitstrm->pu4_buf         = pu4_buf;
    ps_bitstrm->u4_cur_word     = u4_cur_word;
    ps_bitstrm->u4_nxt_word     = u4_nxt_word;

    ps_bitstrm->pu1_buf_max     = pu1_buf + u4_numbytes + 8;

    return;
}